

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration
          (ConversionStream *this,iterator *Token,
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
          *Samplers,ObjectsTypeHashType *Objects,char *SamplerSuffix,Uint32 *ImageBinding)

{
  TokenListType *this_00;
  _List_node_base **pp_Var1;
  const_iterator __position;
  byte bVar2;
  Uint32 UVar3;
  ConversionStream *this_01;
  int iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  ostream *poVar7;
  const_iterator cVar8;
  uint uVar9;
  char (*Args_1) [137];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End;
  Uint32 UVar10;
  iterator iVar11;
  byte bVar12;
  __normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>
  __tmp;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  Uint32 NumComponents;
  String ImgFormat;
  String GLSLSampler;
  String LayoutQualifier;
  String CompleteGLSLSampler;
  string err;
  Uint32 local_2fc;
  HLSLObjectInfo local_2f8;
  ConversionStream *local_2d0;
  _List_node_base *local_2c8;
  char *local_2c0;
  long local_2b8;
  char local_2b0;
  undefined7 uStack_2af;
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290;
  undefined7 uStack_28f;
  char (*local_280) [137];
  undefined8 local_278;
  char local_270;
  char acStack_26f [15];
  ulong local_260;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  long local_250;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  ulong local_218;
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  *local_210;
  char *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  char local_1f8;
  char acStack_1f7 [7];
  size_type sStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [9];
  char acStack_1cf [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  size_t local_1a0;
  ios_base local_168 [272];
  HashMapStringKey local_58;
  Uint32 *local_48;
  char *local_40;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_38;
  
  local_2c8 = Token->_M_node;
  local_218 = (ulong)*(uint *)&local_2c8[1]._M_next;
  uVar9 = *(uint *)&local_2c8[1]._M_next - 0x103;
  local_260 = (ulong)uVar9;
  local_2c0 = &local_2b0;
  local_2b8 = 0;
  local_2b0 = '\0';
  iVar11._M_node = local_2c8->_M_next;
  Token->_M_node = (_List_node_base *)iVar11;
  this_00 = &this->m_Tokens;
  local_2d0 = this;
  local_210 = Samplers;
  local_48 = ImageBinding;
  local_40 = SamplerSuffix;
  local_38 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)Objects;
  if (iVar11._M_node == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
               (char (*) [19])&local_2c8[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x543,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    iVar11 = (iterator)Token->_M_node;
  }
  bVar12 = uVar9 < 8 & 0xf9U >> ((byte)uVar9 & 0x1f);
  local_2a0 = &local_290;
  local_298 = 0;
  local_290 = 0;
  Args_1 = (char (*) [137])&local_270;
  local_278 = 0;
  local_270 = '\0';
  local_2fc = 0;
  local_280 = Args_1;
  iVar4 = std::__cxx11::string::compare((char *)&iVar11._M_node[1]._M_prev);
  if (iVar4 != 0) goto LAB_0037a5ff;
  p_Var5 = Token->_M_node;
  if (*(int *)&p_Var5[1]._M_next != 0x145) {
    FormatString<char[26],char[39]>
              ((string *)local_1e8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])Args_1);
    Args_1 = (char (*) [137])0x54c;
    DebugAssertionFailed
              ((Char *)local_1e8._0_8_,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x54c);
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    p_Var5 = Token->_M_node;
  }
  *(undefined4 *)&p_Var5[1]._M_next = 0x139;
  p_Var5 = p_Var5->_M_next;
  Token->_M_node = p_Var5;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
               (char (*) [19])&local_2c8[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    Args_1 = (char (*) [137])0x550;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x550,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    p_Var5 = Token->_M_node;
  }
  if (*(int *)&p_Var5[1]._M_next == 299) {
    p_Var5 = p_Var5->_M_next;
    Token->_M_node = p_Var5;
    if (p_Var5 == (_List_node_base *)this_00) {
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&local_2c8[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f8.GLSLType,local_2d0,Token,4);
      SamplerSuffix = local_1e8;
      Args_1 = (char (*) [137])0x557;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x557,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
        operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                        local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
      p_Var5 = Token->_M_node;
    }
  }
  p_Var6 = p_Var5;
  if (0xbe < *(int *)&p_Var5[1]._M_next - 1U) {
    FormatString<char[42]>
              ((string *)local_1e8,(char (*) [42])"Texture format type must be built-in type");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    Args_1 = (char (*) [137])0x55d;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x55d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    p_Var6 = Token->_M_node;
  }
  uVar9 = *(uint *)&p_Var6[1]._M_next;
  if ((int)uVar9 < 0x16) {
LAB_00379dee:
    FormatString<std::__cxx11::string,char[137]>
              ((string *)local_1e8,(Diligent *)&p_Var6[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " is not valid texture component type\nOnly the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]"
               ,Args_1);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    Args_1 = (char (*) [137])0x578;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x578,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
LAB_00379e8d:
    if (3 < local_2fc - 1) {
      FormatString<char[38],unsigned_int,char[9]>
                ((string *)local_1e8,(Diligent *)"Between 1 and 4 components expected, ",
                 (char (*) [38])&local_2fc,(uint *)" deduced",(char (*) [9])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f8.GLSLType,local_2d0,Token,4);
      SamplerSuffix = local_1e8;
      Args_1 = (char (*) [137])0x57a;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
        operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                        local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
    }
  }
  else {
    if (uVar9 < 0x1b) {
      if (uVar9 != 0x16) {
        local_2fc = uVar9 - 0x16;
        goto LAB_00379e8d;
      }
      goto LAB_00379d83;
    }
    if (uVar9 < 0x2b) goto LAB_00379dee;
    if (uVar9 < 0x30) {
      std::__cxx11::string::push_back((char)&local_2a0);
      iVar4 = *(int *)&Token->_M_node[1]._M_next;
      if (iVar4 != 0x2b) {
        local_2fc = iVar4 - 0x2b;
        goto LAB_00379e8d;
      }
    }
    else {
      if (4 < uVar9 - 0x40) goto LAB_00379dee;
      std::__cxx11::string::push_back((char)&local_2a0);
      iVar4 = *(int *)&Token->_M_node[1]._M_next;
      if (iVar4 != 0x40) {
        local_2fc = iVar4 - 0x40;
        goto LAB_00379e8d;
      }
    }
LAB_00379d83:
    local_2fc = 1;
  }
  p_Var6 = Token->_M_node->_M_next;
  Token->_M_node = p_Var6;
  if (p_Var6 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
               (char (*) [19])&local_2c8[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    Args_1 = (char (*) [137])0x57d;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x57d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    p_Var6 = Token->_M_node;
  }
  if (((uint)local_218 & 0xfffffffe) == 0x120) {
    iVar4 = std::__cxx11::string::compare((char *)&p_Var6[1]._M_prev);
    p_Var6 = Token->_M_node;
    if (iVar4 == 0) {
      p_Var6 = p_Var6->_M_next;
      Token->_M_node = p_Var6;
      if (p_Var6 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
                   (char (*) [19])&local_2c8[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f8.GLSLType,local_2d0,Token,4);
        SamplerSuffix = local_1e8;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x587,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
          operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                          local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
        }
        p_Var6 = Token->_M_node;
      }
      uVar9 = *(int *)&p_Var6[1]._M_next - 0x13b;
      Args_1 = (char (*) [137])(ulong)uVar9;
      if (1 < uVar9) {
        FormatString<char[34],std::__cxx11::string,char[13]>
                  ((string *)local_1e8,(Diligent *)"Number of samples is expected in ",
                   (char (*) [34])&local_2c8[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f8.GLSLType,local_2d0,Token,4);
        SamplerSuffix = local_1e8;
        Args_1 = (char (*) [137])0x58d;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x58d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
          operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                          local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
        }
        p_Var6 = Token->_M_node;
      }
      p_Var6 = p_Var6->_M_next;
      Token->_M_node = p_Var6;
      if (p_Var6 == (_List_node_base *)this_00) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
                   (char (*) [19])&local_2c8[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
                   (char (*) [13])SamplerSuffix);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f8.GLSLType,local_2d0,Token,4);
        SamplerSuffix = local_1e8;
        Args_1 = (char (*) [137])0x591;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x591,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
          operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                          local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
        }
        p_Var6 = Token->_M_node;
      }
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&p_Var6[1]._M_prev);
  if (iVar4 != 0) {
    FormatString<char[16],std::__cxx11::string,char[13]>
              ((string *)local_1e8,(Diligent *)"Missing \">\" in ",
               (char (*) [16])&local_2c8[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    Args_1 = (char (*) [137])0x595;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x595,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
  }
  p_Var6 = Token->_M_node;
  if (*(int *)&p_Var6[1]._M_next != 0x145) {
    FormatString<char[26],char[39]>
              ((string *)local_1e8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])Args_1);
    DebugAssertionFailed
              ((Char *)local_1e8._0_8_,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x597);
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    p_Var6 = Token->_M_node;
  }
  *(undefined4 *)&p_Var6[1]._M_next = 0x13a;
  if (bVar12 != 0) {
    local_2f8.GLSLType._M_dataplus._M_p = (pointer)p_Var6[3]._M_prev;
    End = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&((_List_node_base *)local_2f8.GLSLType._M_dataplus._M_p)->_M_next +
             (long)p_Var6[4]._M_next);
    local_258._M_current = (char *)End;
    Parsing::
    ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_1e8,(Parsing *)&local_2f8,&local_258,End);
    std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_1e8);
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
    if (local_2b8 == 0) {
      local_2f8.GLSLType._M_dataplus._M_p = (pointer)p_Var5[3]._M_prev;
      local_258._M_current =
           (char *)((long)&((_List_node_base *)local_2f8.GLSLType._M_dataplus._M_p)->_M_next +
                   (long)p_Var5[4]._M_next);
      Parsing::
      ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_1e8,(Parsing *)&local_2f8,&local_258,End);
      std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_1e8);
      if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
      if (local_2b8 == 0) goto LAB_0037a53f;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"layout(",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,local_2c0,local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", binding=",10);
    *local_48 = *local_48 + 1;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
  }
LAB_0037a53f:
  p_Var5 = Token->_M_node->_M_next;
  Token->_M_node = p_Var5;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_1e8,(Diligent *)"Unexpected EOF in ",
               (char (*) [19])&local_2c8[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
               (char (*) [13])SamplerSuffix);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_2f8.GLSLType,local_2d0,Token,4);
    SamplerSuffix = local_1e8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5b2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      SamplerSuffix,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
  }
LAB_0037a5ff:
  std::__cxx11::string::append((char *)&local_2a0);
  if ((uint)local_260 < 0x22) {
    (*(code *)(&DAT_0082f504 + *(int *)(&DAT_0082f504 + local_260 * 4)))();
    return;
  }
  if ((int)local_218 == 0xcf) {
    std::__cxx11::string::append((char *)&local_2a0);
  }
  else {
    FormatString<char[24]>((string *)local_1e8,(char (*) [24])"Unexpected texture type");
    DebugAssertionFailed
              ((Char *)local_1e8._0_8_,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5d4);
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
    }
  }
  p_Var5 = Token->_M_node;
  if (p_Var5 != iVar11._M_node) {
    do {
      p_Var6 = (iVar11._M_node)->_M_next;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      _M_erase(this_00,iVar11);
      iVar11._M_node = p_Var6;
    } while (p_Var6 != p_Var5);
    p_Var5 = Token->_M_node;
  }
  local_260 = (long)(local_210->
                    super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_210->
                    super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (*(int *)&p_Var5[1]._M_next != 0x13b) {
      FormatString<char[24],std::__cxx11::string,char[13]>
                ((string *)local_1e8,(Diligent *)"Identifier expected in ",
                 (char (*) [24])&local_2c8[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x831401,
                 (char (*) [13])SamplerSuffix);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2f8.GLSLType,local_2d0,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5e8,(string *)local_1e8,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
        operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                        local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
      }
      if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
      p_Var5 = Token->_M_node;
    }
    iVar4 = std::__cxx11::string::compare((char *)&p_Var5[3]._M_prev);
    if (iVar4 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&Token->_M_node[3]._M_prev,0,(char *)Token->_M_node[4]._M_next,0x8fd755);
    }
    this_01 = local_2d0;
    p_Var5 = Token->_M_node;
    UVar10 = 0;
    for (local_258._M_current = (char *)p_Var5->_M_next;
        ((TokenListType *)local_258._M_current != this_00 &&
        (*(int *)&((_List_node_base *)((long)local_258._M_current + 0x10))->_M_next == 0x137));
        local_258._M_current = (char *)((_List_node_base *)local_258._M_current)->_M_next) {
      local_1e8._0_8_ =
           (this_00->
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      local_2f8.GLSLType._M_dataplus._M_p = (pointer)this_00;
      local_258._M_current =
           (char *)Parsing::
                   FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_1e8,
                              (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_2f8,
                              local_258._M_current);
      if ((TokenListType *)local_258._M_current == this_00) {
        FormatString<char[48]>
                  ((string *)local_1e8,
                   (char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_2f8.GLSLType,this_01,
                   (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_258,4);
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x5ff,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e8,(char (*) [2])0x82ea05,&local_2f8.GLSLType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
          operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                          local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
        }
        if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
        }
      }
      UVar10 = UVar10 + 1;
    }
    local_258._M_current = (char *)local_248;
    std::__cxx11::string::_M_construct<char*>((string *)&local_258,local_2a0,local_2a0 + local_298);
    if (bVar12 == 0) {
      local_1e8._0_8_ = local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,p_Var5[1]._M_prev,
                 (long)&(p_Var5[1]._M_prev)->_M_next + (long)p_Var5[2]._M_next);
      std::__cxx11::string::append((char *)local_1e8);
      this_02 = &((local_210->
                  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish)->_M_h;
      do {
        if (this_02 ==
            &((local_210->
              super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->_M_h) goto LAB_0037aa1e;
        this_02 = this_02 + -1;
        cVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_02,(key_type *)local_1e8);
      } while (cVar8.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
               ._M_cur == (__node_type *)0x0);
      if (*(char *)((long)cVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                          ._M_cur + 0x28) == '\x01') {
        std::__cxx11::string::append((char *)&local_258);
      }
LAB_0037aa1e:
      if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
    }
    pp_Var1 = &local_2c8[1]._M_prev;
    SamplerSuffix = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)pp_Var1,0,(char *)local_2c8[2]._M_next,0x82b9e8);
    if (local_260 == 0x38) {
      std::__cxx11::string::_M_append((char *)pp_Var1,(ulong)local_280);
      std::__cxx11::string::append((char *)pp_Var1);
      if ((((bVar12 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_2c0), iVar4 != 0)
           ) && (iVar4 = std::__cxx11::string::compare((char *)&local_2c0), iVar4 != 0)) &&
         (iVar4 = std::__cxx11::string::compare((char *)&local_2c0), iVar4 != 0)) {
        std::__cxx11::string::append((char *)pp_Var1);
      }
    }
    std::__cxx11::string::_M_append((char *)pp_Var1,(ulong)local_258._M_current);
    HashMapStringKey::HashMapStringKey(&local_58,(Char *)p_Var5[1]._M_prev,true);
    UVar3 = local_2fc;
    local_2f8.GLSLType._M_dataplus._M_p = (pointer)&local_2f8.GLSLType.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_258._M_current,local_258._M_current + local_250);
    local_2f8.NumComponents = UVar3;
    local_2f8.ArrayDim = UVar10;
    std::pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>::
    pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo,_true>
              ((pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo> *
               )local_1e8,&local_58,&local_2f8);
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>
              (local_38,(pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>
                         *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &aStack_1c8) {
      operator_delete((void *)local_1d8._0_8_,aStack_1c8._M_allocated_capacity + 1);
    }
    if (((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)0x0) &&
       ((long)local_1e8._8_8_ < 0)) {
      operator_delete__((void *)local_1e8._0_8_);
    }
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.GLSLType._M_dataplus._M_p != &local_2f8.GLSLType.field_2) {
      operator_delete(local_2f8.GLSLType._M_dataplus._M_p,
                      local_2f8.GLSLType.field_2._M_allocated_capacity + 1);
    }
    if ((local_58.Str != (Char *)0x0) && ((long)local_58.Ownership_Hash < 0)) {
      operator_delete__(local_58.Str);
    }
    iVar11 = (iterator)Token->_M_node;
    bVar2 = 1;
    if (iVar11._M_node != (_List_node_base *)this_00 && local_260 == 0x38) {
      do {
        if ((*(uint *)&iVar11._M_node[1]._M_next & 0xfffffffe) == 0x13e) {
          if (*(uint *)&iVar11._M_node[1]._M_next == 0x13f) {
            *(undefined4 *)&iVar11._M_node[1]._M_next = 0x13e;
            SamplerSuffix = (char *)0x1;
            std::__cxx11::string::_M_replace
                      ((ulong)&iVar11._M_node[1]._M_prev,0,(char *)iVar11._M_node[2]._M_next,
                       0x91f319);
            __position._M_node = Token->_M_node->_M_next;
            Token->_M_node = __position._M_node;
            local_208 = &local_1f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
            local_238 = &local_228;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"\n","");
            local_1e8._0_4_ = (int)local_218;
            local_1e8._8_8_ = local_1d8 + 8;
            aStack_1c8._8_8_ = &local_1b0;
            if (local_208 == &local_1f8) {
              aStack_1c8._M_allocated_capacity = sStack_1f0;
            }
            else {
              local_1e8._8_8_ = local_208;
            }
            acStack_1cf[0] = acStack_1f7[0];
            acStack_1cf[1] = acStack_1f7[1];
            acStack_1cf[2] = acStack_1f7[2];
            acStack_1cf[3] = acStack_1f7[3];
            acStack_1cf[4] = acStack_1f7[4];
            acStack_1cf[5] = acStack_1f7[5];
            acStack_1cf[6] = acStack_1f7[6];
            local_1d8[8] = local_1f8;
            local_1d8._0_8_ = local_200;
            local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_1f8 = '\0';
            if (local_238 == &local_228) {
              local_1b0._8_8_ = local_228._8_8_;
            }
            else {
              aStack_1c8._8_8_ = local_238;
            }
            local_1b0._M_allocated_capacity._1_7_ = local_228._M_allocated_capacity._1_7_;
            local_1b0._M_local_buf[0] = local_228._M_local_buf[0];
            local_1b8 = local_230;
            local_230 = 0;
            local_228._M_local_buf[0] = '\0';
            local_1a0 = 0xffffffffffffffff;
            local_238 = &local_228;
            local_208 = &local_1f8;
            local_2c8 = (_List_node_base *)
                        std::__cxx11::
                        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                        ::emplace<Diligent::Parsing::HLSLTokenInfo>
                                  (this_00,__position,(HLSLTokenInfo *)local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)aStack_1c8._8_8_ != &local_1b0) {
              operator_delete((void *)aStack_1c8._8_8_,local_1b0._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_1e8._8_8_ != local_1d8 + 8) {
              operator_delete((void *)local_1e8._8_8_,stack0xfffffffffffffe30 + 1);
            }
            if (local_238 != &local_228) {
              operator_delete(local_238,
                              CONCAT71(local_228._M_allocated_capacity._1_7_,
                                       local_228._M_local_buf[0]) + 1);
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,CONCAT71(acStack_1f7,local_1f8) + 1);
            }
          }
          else {
            Token->_M_node = (iVar11._M_node)->_M_next;
            bVar2 = 0;
          }
          break;
        }
        iVar4 = std::__cxx11::string::compare((char *)&iVar11._M_node[1]._M_prev);
        iVar11 = (iterator)Token->_M_node;
        if (iVar4 == 0) {
          while ((iVar11._M_node != (_List_node_base *)this_00 &&
                 (((ulong)iVar11._M_node[1]._M_next & 0xfffffffe) != 0x13e))) {
            Token->_M_node = (iVar11._M_node)->_M_next;
            std::__cxx11::
            list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            ::_M_erase(this_00,iVar11);
            iVar11 = (iterator)Token->_M_node;
          }
        }
        else {
          iVar11._M_node = (iVar11._M_node)->_M_next;
          Token->_M_node = (_List_node_base *)iVar11;
        }
      } while (iVar11._M_node != (_List_node_base *)this_00);
    }
    if ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_258._M_current != local_248) {
      operator_delete(local_258._M_current,(ulong)(local_248[0]._M_current + 1));
    }
    if ((!(bool)(bVar2 & local_260 == 0x38)) ||
       (p_Var5 = Token->_M_node, p_Var5 == (_List_node_base *)this_00)) {
      if (local_280 != (char (*) [137])&local_270) {
        operator_delete(local_280,CONCAT71(acStack_26f._0_7_,local_270) + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration(TokenListType::iterator&            Token,
                                                                         const std::vector<SamplerHashType>& Samplers,
                                                                         ObjectsTypeHashType&                Objects,
                                                                         const char*                         SamplerSuffix,
                                                                         Uint32&                             ImageBinding)
{
    auto TexDeclToken = Token;
    auto TextureDim   = TexDeclToken->Type;
    // Texture2D < float > ... ;
    // ^
    bool IsRWTexture =
        TextureDim == TokenType::kw_RWTexture1D ||
        TextureDim == TokenType::kw_RWTexture1DArray ||
        TextureDim == TokenType::kw_RWTexture2D ||
        TextureDim == TokenType::kw_RWTexture2DArray ||
        TextureDim == TokenType::kw_RWTexture3D ||
        TextureDim == TokenType::kw_RWBuffer;
    String ImgFormat;

    ++Token;
    // Texture2D < float > ... ;
    //           ^
#define CHECK_EOF() VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", TexDeclToken->Literal, " declaration")
    CHECK_EOF();

    auto   TypeDefinitionStart = Token;
    String GLSLSampler;
    String LayoutQualifier;
    Uint32 NumComponents = 0;
    if (Token->Literal == "<")
    {
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::OpenAngleBracket;

        ++Token;
        CHECK_EOF();

        if (Token->Type == TokenType::kw_unorm)
        {
            // RWTexture2D < unorm float4 > ... ;
            //               ^
            ++Token;
            CHECK_EOF();
        }

        // Texture2D < float > ... ;
        //             ^
        auto TexFmtToken = Token;
        VERIFY_PARSER_STATE(Token, Token->IsBuiltInType(), "Texture format type must be built-in type");
        if (Token->Type >= TokenType::kw_float && Token->Type <= TokenType::kw_float4)
        {
            if (Token->Type == TokenType::kw_float)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_float);
        }
        else if (Token->Type >= TokenType::kw_int && Token->Type <= TokenType::kw_int4)
        {
            GLSLSampler.push_back('i');
            if (Token->Type == TokenType::kw_int)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_int);
        }
        else if (Token->Type >= TokenType::kw_uint && Token->Type <= TokenType::kw_uint4)
        {
            GLSLSampler.push_back('u');
            if (Token->Type == TokenType::kw_uint)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_uint);
        }
        else
        {
            VERIFY_PARSER_STATE(Token, false, Token->Literal, " is not valid texture component type\n"
                                                              "Only the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]");
        }
        VERIFY_PARSER_STATE(Token, NumComponents >= 1 && NumComponents <= 4, "Between 1 and 4 components expected, ", NumComponents, " deduced");

        ++Token;
        CHECK_EOF();
        // Texture2D < float > ... ;
        //                   ^
        if ((TextureDim == TokenType::kw_Texture2DMS ||
             TextureDim == TokenType::kw_Texture2DMSArray) &&
            Token->Literal == ",")
        {
            // Texture2DMS < float, 4 > ... ;
            //                    ^
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                      ^
            // Texture2DMS < float, SAMPLE_COUNT > ... ;
            //                      ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier,
                                "Number of samples is expected in ", TexDeclToken->Literal, " declaration");

            // We do not really need the number of samples, so just skip it
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                        ^
        }
        VERIFY_PARSER_STATE(Token, Token->Literal == ">", "Missing \">\" in ", TexDeclToken->Literal, " declaration");
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::ClosingAngleBracket;

        if (IsRWTexture)
        {
            // RWTexture2D<float /* format = r32f */ >
            //                                       ^
            ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(Token->Delimiter.begin(), Token->Delimiter.end());
            if (ImgFormat.length() == 0)
            {
                // RWTexture2D</* format = r32f */ float >
                //                                 ^
                //                            TexFmtToken
                ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(TexFmtToken->Delimiter.begin(), TexFmtToken->Delimiter.end());
            }

            if (ImgFormat.length() != 0)
            {
                std::stringstream ss;
                ss << "layout(" << ImgFormat << ", binding=" << ImageBinding++ << ")";
                LayoutQualifier = ss.str();
            }
        }

        ++Token;
        // Texture2D < float > TexName ;
        //                     ^
        CHECK_EOF();
    }

    if (IsRWTexture)
        GLSLSampler.append("image");
    else
        GLSLSampler.append("sampler");

    switch (TextureDim)
    {
        // clang-format off
        case TokenType::kw_RWTexture1D:
        case TokenType::kw_Texture1D:          GLSLSampler += "1D";        break;

        case TokenType::kw_RWTexture1DArray:
        case TokenType::kw_Texture1DArray:     GLSLSampler += "1DArray";   break;

        case TokenType::kw_RWTexture2D:
        case TokenType::kw_Texture2D:          GLSLSampler += "2D";        break;

        case TokenType::kw_RWTexture2DArray:
        case TokenType::kw_Texture2DArray:     GLSLSampler += "2DArray";   break;

        case TokenType::kw_RWTexture3D:
        case TokenType::kw_Texture3D:          GLSLSampler += "3D";        break;

        case TokenType::kw_TextureCube:        GLSLSampler += "Cube";      break;
        case TokenType::kw_TextureCubeArray:   GLSLSampler += "CubeArray"; break;
        case TokenType::kw_Texture2DMS:        GLSLSampler += "2DMS";      break;
        case TokenType::kw_Texture2DMSArray:   GLSLSampler += "2DMSArray"; break;

        case TokenType::kw_RWBuffer:
        case TokenType::kw_Buffer:             GLSLSampler += "Buffer";    break;
        // clang-format on
        default: UNEXPECTED("Unexpected texture type");
    }

    //   TypeDefinitionStart
    //           |
    // Texture2D < float > TexName ;
    //                     ^
    m_Tokens.erase(TypeDefinitionStart, Token);
    // Texture2D TexName ;
    //           ^

    bool IsGlobalScope = Samplers.size() == 1;

    // There may be more than one texture variable declared in the same
    // statement:
    // Texture2D<float> g_Tex2D1, g_Tex2D1;
    do
    {
        // Texture2D TexName ;
        //           ^
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in ", TexDeclToken->Literal, " declaration");

        // Make sure there is a delimiter between sampler keyword and the
        // identifier. In cases like this
        // Texture2D<float>Name;
        // There will be no whitespace
        if (Token->Delimiter == "")
            Token->Delimiter = " ";

        // Texture2D TexName ;
        //           ^
        const auto& TextureName = Token->Literal;

        // Determine resource array dimensionality
        Uint32 ArrayDim = 0;
        {
            auto TmpToken = Token;
            ++TmpToken;
            while (TmpToken != m_Tokens.end() && TmpToken->Type == TokenType::OpenSquareBracket)
            {
                // Texture2D TexName[...][...]
                //                  ^
                TmpToken = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), TmpToken);
                VERIFY_PARSER_STATE(TmpToken, TmpToken != m_Tokens.end(), "Unable to find matching closing square bracket.");

                // Texture2D TexName[...][...]
                //                      ^

                ++ArrayDim;

                ++TmpToken;
                // Texture2D TexName[...][...]
                //                       ^
            }
        }

        auto CompleteGLSLSampler = GLSLSampler;
        if (!IsRWTexture)
        {
            // Try to find matching sampler
            auto SamplerName = TextureName + SamplerSuffix;
            // Search all scopes starting with the innermost
            for (auto ScopeIt = Samplers.rbegin(); ScopeIt != Samplers.rend(); ++ScopeIt)
            {
                auto SamplerIt = ScopeIt->find(SamplerName);
                if (SamplerIt != ScopeIt->end())
                {
                    if (SamplerIt->second)
                        CompleteGLSLSampler.append("Shadow");
                    break;
                }
            }
        }

        // TexDeclToken
        // |
        // Texture2D TexName ;
        //           ^
        TexDeclToken->Literal = "";
        if (IsGlobalScope)
        {
            // Use layout qualifier for global variables only, not for function arguments
            TexDeclToken->Literal.append(LayoutQualifier);
            // Samplers and images in global scope must be declared uniform.
            // Function arguments must not be declared uniform
            TexDeclToken->Literal.append("uniform ");
            // From GLES 3.1 spec:
            //    Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui,
            //    image variables must specify either memory qualifier readonly or the memory qualifier writeonly.
            // So on GLES we have to assume that an image is a writeonly variable
            if (IsRWTexture && ImgFormat != "r32f" && ImgFormat != "r32i" && ImgFormat != "r32ui")
                TexDeclToken->Literal.append("IMAGE_WRITEONLY "); // defined as 'writeonly' on GLES and as '' on desktop in GLSLDefinitions.h
        }
        TexDeclToken->Literal.append(CompleteGLSLSampler);
        Objects.m.insert(std::make_pair(HashMapStringKey(TextureName), HLSLObjectInfo{std::move(CompleteGLSLSampler), NumComponents, ArrayDim}));

        // In global scope, multiple variables can be declared in the same statement
        if (IsGlobalScope)
        {
            // Texture2D TexName, TexName2 ;
            //           ^

            // Go to the next texture in the declaration or to the statement end, removing register declarations
            while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
            {
                if (Token->Literal == ":")
                {
                    // Texture2D TexName : register(t0);
                    // Texture2D TexName : register(t0),
                    //                   ^

                    // Remove register
                    while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    {
                        auto CurrToken = Token;
                        ++Token;
                        m_Tokens.erase(CurrToken);
                    }

                    // Texture2D TexName ,
                    //                   ^
                }
                else
                {
                    ++Token;
                }
            }

            if (Token != m_Tokens.end())
            {
                if (Token->Type == TokenType::Comma)
                {
                    // Texture2D TexName, TexName2 ;
                    //                  ^
                    Token->Type    = TokenType::Semicolon;
                    Token->Literal = ";";
                    // Texture2D TexName; TexName2 ;
                    //                  ^

                    ++Token;
                    // Texture2D TexName; TexName2 ;
                    //                    ^

                    // Insert empty token that will contain next sampler/image declaration
                    TexDeclToken = m_Tokens.insert(Token, TokenInfo(TextureDim, "", "\n"));
                    // Texture2D TexName;
                    // <Texture Declaration TBD> TexName2 ;
                    // ^                         ^
                    // TexDeclToken              Token
                }
                else
                {
                    // Texture2D TexName, TexName2 ;
                    //                             ^
                    ++Token;
                    break;
                }
            }
        }
    } while (IsGlobalScope && Token != m_Tokens.end());

#undef SKIP_DELIMITER
#undef CHECK_EOF
}